

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

int multi_getsock(SessionHandle *data,curl_socket_t *socks,int numsocks)

{
  CURLMstate CVar1;
  connectdata *conn;
  _func_int_connectdata_ptr_curl_socket_t_ptr_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int i;
  long lVar5;
  
  uVar2 = 0;
  uVar4 = 0;
  if (((data->state).pipe_broke == false) &&
     (conn = data->easy_conn, uVar4 = uVar2, conn != (connectdata *)0x0)) {
    CVar1 = data->mstate;
    if (CVar1 - CURLM_STATE_WAITRESOLVE < 0xd) {
      conn->data = data;
    }
    switch(CVar1) {
    case CURLM_STATE_WAITCONNECT:
    case CURLM_STATE_WAITPROXYCONNECT:
      lVar5 = 0;
      uVar4 = 0;
      iVar3 = 0;
      do {
        if (conn->tempsock[lVar5] != -1) {
          socks[iVar3] = conn->tempsock[lVar5];
          uVar4 = uVar4 | 1 << ((byte)((char)iVar3 + 0x10) & 0x1f);
          iVar3 = iVar3 + 1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      if (conn->tunnel_state[0] == TUNNEL_CONNECT) {
        *socks = conn->sock[0];
        uVar4 = 1;
      }
      break;
    case CURLM_STATE_PROTOCONNECT:
      iVar3 = Curl_protocol_getsock(conn,socks,5);
      return iVar3;
    case CURLM_STATE_DO:
    case CURLM_STATE_DOING:
      iVar3 = Curl_doing_getsock(conn,socks,5);
      return iVar3;
    case CURLM_STATE_DO_MORE:
      UNRECOVERED_JUMPTABLE = conn->handler->domore_getsock;
      if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
        iVar3 = (*UNRECOVERED_JUMPTABLE)(conn,socks,5);
        return iVar3;
      }
      break;
    case CURLM_STATE_DO_DONE:
    case CURLM_STATE_WAITPERFORM:
    case CURLM_STATE_PERFORM:
      iVar3 = Curl_single_getsock(conn,socks,5);
      return iVar3;
    }
  }
  return uVar4;
}

Assistant:

static int multi_getsock(struct SessionHandle *data,
                         curl_socket_t *socks, /* points to numsocks number
                                                  of sockets */
                         int numsocks)
{
  /* If the pipe broke, or if there's no connection left for this easy handle,
     then we MUST bail out now with no bitmask set. The no connection case can
     happen when this is called from curl_multi_remove_handle() =>
     singlesocket() => multi_getsock().
  */
  if(data->state.pipe_broke || !data->easy_conn)
    return 0;

  if(data->mstate > CURLM_STATE_CONNECT &&
     data->mstate < CURLM_STATE_COMPLETED) {
    /* Set up ownership correctly */
    data->easy_conn->data = data;
  }

  switch(data->mstate) {
  default:
#if 0 /* switch back on these cases to get the compiler to check for all enums
         to be present */
  case CURLM_STATE_TOOFAST:  /* returns 0, so will not select. */
  case CURLM_STATE_COMPLETED:
  case CURLM_STATE_MSGSENT:
  case CURLM_STATE_INIT:
  case CURLM_STATE_CONNECT:
  case CURLM_STATE_WAITDO:
  case CURLM_STATE_DONE:
  case CURLM_STATE_LAST:
    /* this will get called with CURLM_STATE_COMPLETED when a handle is
       removed */
#endif
    return 0;

  case CURLM_STATE_WAITRESOLVE:
    return Curl_resolver_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_PROTOCONNECT:
    return Curl_protocol_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO:
  case CURLM_STATE_DOING:
    return Curl_doing_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_WAITPROXYCONNECT:
  case CURLM_STATE_WAITCONNECT:
    return waitconnect_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO_MORE:
    return domore_getsock(data->easy_conn, socks, numsocks);

  case CURLM_STATE_DO_DONE: /* since is set after DO is completed, we switch
                               to waiting for the same as the *PERFORM
                               states */
  case CURLM_STATE_PERFORM:
  case CURLM_STATE_WAITPERFORM:
    return Curl_single_getsock(data->easy_conn, socks, numsocks);
  }

}